

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_getinfo(lua_State *L)

{
  int iVar1;
  lua_State *L1_00;
  lua_Integer lVar2;
  char *pcVar3;
  char *local_b0;
  char *options;
  lua_State *L1;
  undefined1 local_98 [4];
  int arg;
  lua_Debug ar;
  lua_State *L_local;
  
  ar.i_ci = (CallInfo *)L;
  L1_00 = getthread(L,(int *)((long)&L1 + 4));
  local_b0 = luaL_optlstring((lua_State *)ar.i_ci,L1._4_4_ + 2,"flnStu",(size_t *)0x0);
  checkstack((lua_State *)ar.i_ci,L1_00,3);
  iVar1 = lua_type((lua_State *)ar.i_ci,L1._4_4_ + 1);
  if (iVar1 == 6) {
    local_b0 = lua_pushfstring((lua_State *)ar.i_ci,">%s",local_b0);
    lua_pushvalue((lua_State *)ar.i_ci,L1._4_4_ + 1);
    lua_xmove((lua_State *)ar.i_ci,L1_00,1);
  }
  else {
    lVar2 = luaL_checkinteger((lua_State *)ar.i_ci,L1._4_4_ + 1);
    iVar1 = lua_getstack(L1_00,(int)lVar2,(lua_Debug *)local_98);
    if (iVar1 == 0) {
      lua_pushnil((lua_State *)ar.i_ci);
      return 1;
    }
  }
  iVar1 = lua_getinfo(L1_00,local_b0,(lua_Debug *)local_98);
  if (iVar1 == 0) {
    L_local._4_4_ = luaL_argerror((lua_State *)ar.i_ci,L1._4_4_ + 2,"invalid option");
  }
  else {
    lua_createtable((lua_State *)ar.i_ci,0,0);
    pcVar3 = strchr(local_b0,0x53);
    if (pcVar3 != (char *)0x0) {
      settabss((lua_State *)ar.i_ci,"source",ar.what);
      settabss((lua_State *)ar.i_ci,"short_src",(char *)&ar.lastlinedefined);
      settabsi((lua_State *)ar.i_ci,"linedefined",ar.source._4_4_);
      settabsi((lua_State *)ar.i_ci,"lastlinedefined",ar.currentline);
      settabss((lua_State *)ar.i_ci,"what",ar.namewhat);
    }
    pcVar3 = strchr(local_b0,0x6c);
    if (pcVar3 != (char *)0x0) {
      settabsi((lua_State *)ar.i_ci,"currentline",(int)ar.source);
    }
    pcVar3 = strchr(local_b0,0x75);
    if (pcVar3 != (char *)0x0) {
      settabsi((lua_State *)ar.i_ci,"nups",(uint)(byte)ar.linedefined);
      settabsi((lua_State *)ar.i_ci,"nparams",(uint)ar.linedefined._1_1_);
      settabsb((lua_State *)ar.i_ci,"isvararg",(int)ar.linedefined._2_1_);
    }
    pcVar3 = strchr(local_b0,0x6e);
    if (pcVar3 != (char *)0x0) {
      settabss((lua_State *)ar.i_ci,"name",(char *)ar._0_8_);
      settabss((lua_State *)ar.i_ci,"namewhat",ar.name);
    }
    pcVar3 = strchr(local_b0,0x74);
    if (pcVar3 != (char *)0x0) {
      settabsb((lua_State *)ar.i_ci,"istailcall",(int)ar.linedefined._3_1_);
    }
    pcVar3 = strchr(local_b0,0x4c);
    if (pcVar3 != (char *)0x0) {
      treatstackoption((lua_State *)ar.i_ci,L1_00,"activelines");
    }
    pcVar3 = strchr(local_b0,0x66);
    if (pcVar3 != (char *)0x0) {
      treatstackoption((lua_State *)ar.i_ci,L1_00,"func");
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int db_getinfo (lua_State *L) {
  lua_Debug ar;
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnStu");
  checkstack(L, L1, 3);
  if (lua_isfunction(L, arg + 1)) {  /* info about a function? */
    options = lua_pushfstring(L, ">%s", options);  /* add '>' to 'options' */
    lua_pushvalue(L, arg + 1);  /* move function to 'L1' stack */
    lua_xmove(L, L1, 1);
  }
  else {  /* stack level */
    if (!lua_getstack(L1, (int)luaL_checkinteger(L, arg + 1), &ar)) {
      lua_pushnil(L);  /* level out of range */
      return 1;
    }
  }
  if (!lua_getinfo(L1, options, &ar))
    return luaL_argerror(L, arg+2, "invalid option");
  lua_newtable(L);  /* table to collect results */
  if (strchr(options, 'S')) {
    settabss(L, "source", ar.source);
    settabss(L, "short_src", ar.short_src);
    settabsi(L, "linedefined", ar.linedefined);
    settabsi(L, "lastlinedefined", ar.lastlinedefined);
    settabss(L, "what", ar.what);
  }
  if (strchr(options, 'l'))
    settabsi(L, "currentline", ar.currentline);
  if (strchr(options, 'u')) {
    settabsi(L, "nups", ar.nups);
    settabsi(L, "nparams", ar.nparams);
    settabsb(L, "isvararg", ar.isvararg);
  }
  if (strchr(options, 'n')) {
    settabss(L, "name", ar.name);
    settabss(L, "namewhat", ar.namewhat);
  }
  if (strchr(options, 't'))
    settabsb(L, "istailcall", ar.istailcall);
  if (strchr(options, 'L'))
    treatstackoption(L, L1, "activelines");
  if (strchr(options, 'f'))
    treatstackoption(L, L1, "func");
  return 1;  /* return table */
}